

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

EnumDescriptorProto_EnumReservedRange *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
          (Arena *arena)

{
  EnumDescriptorProto_EnumReservedRange *pEVar1;
  
  if (arena == (Arena *)0x0) {
    pEVar1 = (EnumDescriptorProto_EnumReservedRange *)operator_new(0x20);
    (pEVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__EnumDescriptorProto_EnumReservedRange_0064b8e0;
    (pEVar1->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = (void *)0x0;
    pEVar1->_has_bits_ = (uint32  [1])0x0;
    pEVar1->_cached_size_ = (atomic<int>)0x0;
    pEVar1->start_ = 0;
    pEVar1->end_ = 0;
  }
  else {
    AllocHook(arena,(type_info *)&EnumDescriptorProto_EnumReservedRange::typeinfo,0x20);
    pEVar1 = (EnumDescriptorProto_EnumReservedRange *)
             internal::ArenaImpl::AllocateAligned(&arena->impl_,0x20);
    (pEVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__EnumDescriptorProto_EnumReservedRange_0064b8e0;
    (pEVar1->_internal_metadata_).
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_ = arena;
    pEVar1->_has_bits_ = (uint32  [1])0x0;
    pEVar1->_cached_size_ = (atomic<int>)0x0;
    pEVar1->start_ = 0;
    pEVar1->end_ = 0;
  }
  return pEVar1;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}